

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O0

void __thiscall
ProtocolIPv4::ProtocolIPv4
          (ProtocolIPv4 *this,InterfaceMAC *mac,ProtocolARP *arp,ProtocolICMP *icmp,ProtocolTCP *tcp
          ,ProtocolUDP *udp)

{
  ProtocolUDP *udp_local;
  ProtocolTCP *tcp_local;
  ProtocolICMP *icmp_local;
  ProtocolARP *arp_local;
  InterfaceMAC *mac_local;
  ProtocolIPv4 *this_local;
  
  this->PacketID = 0;
  osQueue::osQueue(&this->UnresolvedQueue,"IP",0x14,this->TxBuffer);
  memset(&this->Address,0,0x24);
  this->MAC = mac;
  this->ARP = arp;
  this->ICMP = icmp;
  this->TCP = tcp;
  this->UDP = udp;
  (this->Address).DataValid = false;
  return;
}

Assistant:

ProtocolIPv4::ProtocolIPv4(
    InterfaceMAC& mac, ProtocolARP& arp, ProtocolICMP& icmp, ProtocolTCP& tcp, ProtocolUDP& udp)
    : PacketID(0)
    , UnresolvedQueue("IP", TX_BUFFER_COUNT, TxBuffer)
    , Address()
    , MAC(mac)
    , ARP(arp)
    , ICMP(icmp)
    , TCP(tcp)
    , UDP(udp)
{
    Address.DataValid = false;
}